

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port_connector_change_table.c
# Opt level: O0

apx_error_t
apx_portConnectorChangeTable_create(apx_portConnectorChangeTable_t *self,apx_size_t num_ports)

{
  apx_portConnectorChangeEntry_t *paVar1;
  uint local_20;
  apx_size_t i;
  apx_size_t num_ports_local;
  apx_portConnectorChangeTable_t *self_local;
  
  if ((self == (apx_portConnectorChangeTable_t *)0x0) || (num_ports == 0)) {
    self_local._4_4_ = 1;
  }
  else {
    self->num_ports = num_ports;
    paVar1 = (apx_portConnectorChangeEntry_t *)malloc((ulong)num_ports << 4);
    self->entries = paVar1;
    if (self->entries == (apx_portConnectorChangeEntry_t *)0x0) {
      self_local._4_4_ = 2;
    }
    else {
      for (local_20 = 0; local_20 < self->num_ports; local_20 = local_20 + 1) {
        apx_portConnectorChangeEntry_create(self->entries + local_20);
      }
      self_local._4_4_ = 0;
    }
  }
  return self_local._4_4_;
}

Assistant:

apx_error_t apx_portConnectorChangeTable_create(apx_portConnectorChangeTable_t *self, apx_size_t num_ports)
{
   if ( (self != NULL) && (num_ports > 0) )
   {
      apx_size_t i;
      self->num_ports = num_ports;
      self->entries = (apx_portConnectorChangeEntry_t*) malloc(sizeof(apx_portConnectorChangeEntry_t)*num_ports);
      if (self->entries == 0)
      {
         return APX_MEM_ERROR;
      }
      for (i=0; i<self->num_ports; i++)
      {
         apx_portConnectorChangeEntry_create(&self->entries[i]);
      }
      return APX_NO_ERROR;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}